

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_walldraw.cpp
# Opt level: O0

void swrenderer::R_DrawDrawSeg
               (drawseg_t *ds,int x1,int x2,short *uwal,short *dwal,float *swal,fixed_t *lwal,
               double yrepeat)

{
  int iVar1;
  double a;
  double a_00;
  double b;
  double b_00;
  double local_68;
  double bot;
  double top;
  double frontfz2;
  double frontcz2;
  double frontfz1;
  double frontcz1;
  double yrepeat_local;
  float *swal_local;
  short *dwal_local;
  short *uwal_local;
  int x2_local;
  int x1_local;
  drawseg_t *ds_local;
  
  iVar1 = FTexture::GetHeight(rw_pic);
  if (iVar1 == 1 << (rw_pic->HeightBits & 0x1f)) {
    ProcessWall(x1,x2,uwal,dwal,swal,lwal,yrepeat,true);
  }
  else {
    a = secplane_t::ZatPoint(&ds->curline->frontsector->ceilingplane,ds->curline->v1);
    a_00 = secplane_t::ZatPoint(&ds->curline->frontsector->floorplane,ds->curline->v1);
    b = secplane_t::ZatPoint(&ds->curline->frontsector->ceilingplane,ds->curline->v2);
    b_00 = secplane_t::ZatPoint(&ds->curline->frontsector->floorplane,ds->curline->v2);
    bot = MAX<double>(a,b);
    local_68 = MIN<double>(a_00,b_00);
    if ((fake3D & 2) != 0) {
      bot = MIN<double>(bot,sclipTop);
    }
    if ((fake3D & 1) != 0) {
      local_68 = MAX<double>(local_68,sclipBottom);
    }
    ProcessWallNP2(x1,x2,uwal,dwal,swal,lwal,yrepeat,bot,local_68,true);
  }
  return;
}

Assistant:

void R_DrawDrawSeg(drawseg_t *ds, int x1, int x2, short *uwal, short *dwal, float *swal, fixed_t *lwal, double yrepeat)
{
	if (rw_pic->GetHeight() != 1 << rw_pic->HeightBits)
	{
		double frontcz1 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v1);
		double frontfz1 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v1);
		double frontcz2 = ds->curline->frontsector->ceilingplane.ZatPoint(ds->curline->v2);
		double frontfz2 = ds->curline->frontsector->floorplane.ZatPoint(ds->curline->v2);
		double top = MAX(frontcz1, frontcz2);
		double bot = MIN(frontfz1, frontfz2);
		if (fake3D & FAKE3D_CLIPTOP)
		{
			top = MIN(top, sclipTop);
		}
		if (fake3D & FAKE3D_CLIPBOTTOM)
		{
			bot = MAX(bot, sclipBottom);
		}
		ProcessWallNP2(x1, x2, uwal, dwal, swal, lwal, yrepeat, top, bot, true);
	}
	else
	{
		ProcessWall(x1, x2, uwal, dwal, swal, lwal, yrepeat, true);
	}
}